

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plurrule.cpp
# Opt level: O1

int32_t icu_63::FixedDecimal::decimals(double n)

{
  char *pcVar1;
  double __x;
  double dVar2;
  double dVar3;
  int iVar4;
  long lVar5;
  int32_t iVar6;
  int32_t iVar7;
  long lVar8;
  bool bVar9;
  char buf [30];
  undefined4 local_58;
  char local_38 [32];
  
  __x = ABS(n);
  dVar2 = floor(__x);
  iVar7 = 0;
  if ((__x != dVar2) || (NAN(__x) || NAN(dVar2))) {
    lVar8 = 1;
    iVar7 = 0;
    do {
      lVar5 = lVar8;
      if (lVar5 == 4) break;
      dVar2 = (double)(int)(&p10)[lVar5] * __x;
      dVar3 = floor(dVar2);
      iVar6 = (int32_t)lVar5;
      if (dVar2 != dVar3) {
        iVar6 = iVar7;
      }
      if (!NAN(dVar2) && !NAN(dVar3)) {
        iVar7 = iVar6;
      }
      lVar8 = lVar5 + 1;
    } while ((dVar2 != dVar3) || (NAN(dVar2) || NAN(dVar3)));
    bVar9 = 2 < lVar5 - 1U;
  }
  else {
    bVar9 = false;
  }
  if (bVar9) {
    local_38[0x10] = '\0';
    local_38[0x11] = '\0';
    local_38[0x12] = '\0';
    local_38[0x13] = '\0';
    local_38[0x14] = '\0';
    local_38[0x15] = '\0';
    local_38[0x16] = '\0';
    local_38[0x17] = '\0';
    local_38[0x18] = '\0';
    local_38[0x19] = '\0';
    local_38[0x1a] = '\0';
    local_38[0x1b] = '\0';
    local_38[0x1c] = '\0';
    local_38[0x1d] = '\0';
    local_38[0] = '\0';
    local_38[1] = '\0';
    local_38[2] = '\0';
    local_38[3] = '\0';
    local_38[4] = '\0';
    local_38[5] = '\0';
    local_38[6] = '\0';
    local_38[7] = '\0';
    local_38[8] = '\0';
    local_38[9] = '\0';
    local_38[10] = '\0';
    local_38[0xb] = '\0';
    local_38[0xc] = '\0';
    local_38[0xd] = '\0';
    local_38[0xe] = '\0';
    local_38[0xf] = '\0';
    local_58 = SUB84(__x,0);
    sprintf(local_38,"%1.15e",local_58);
    iVar4 = atoi(local_38 + 0x12);
    lVar8 = 0xf;
    if (local_38[0x10] == '0') {
      lVar8 = 0xf;
      do {
        pcVar1 = local_38 + lVar8;
        lVar8 = lVar8 + -1;
      } while (*pcVar1 == '0');
    }
    iVar7 = (int)lVar8 - iVar4;
  }
  return iVar7;
}

Assistant:

int32_t FixedDecimal::decimals(double n) {
    // Count the number of decimal digits in the fraction part of the number, excluding trailing zeros.
    // fastpath the common cases, integers or fractions with 3 or fewer digits
    n = fabs(n);
    for (int ndigits=0; ndigits<=3; ndigits++) {
        double scaledN = n * p10[ndigits];
        if (scaledN == floor(scaledN)) {
            return ndigits;
        }
    }

    // Slow path, convert with sprintf, parse converted output.
    char  buf[30] = {0};
    sprintf(buf, "%1.15e", n);
    // formatted number looks like this: 1.234567890123457e-01
    int exponent = atoi(buf+18);
    int numFractionDigits = 15;
    for (int i=16; ; --i) {
        if (buf[i] != '0') {
            break;
        }
        --numFractionDigits;
    }
    numFractionDigits -= exponent;   // Fraction part of fixed point representation.
    return numFractionDigits;
}